

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

void __thiscall cmCTest::Log(cmCTest *this,int logType,char *file,int line,char *msg,bool suppress)

{
  char cVar1;
  unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> uVar2;
  __uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> _Var3;
  __uniq_ptr_data<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>,_true,_true>
  _Var4;
  ostream *poVar5;
  ostream *poVar6;
  size_t sVar7;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  long lVar10;
  _Head_base<0UL,_cmGeneratedFileStream_*,_false> _Var11;
  string msg_str;
  undefined1 local_51;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  long local_48;
  long local_40 [2];
  
  if (msg == (char *)0x0) {
    return;
  }
  if (logType != 7 && suppress) {
    return;
  }
  if (*msg == '\0') {
    return;
  }
  _Var8._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  if (logType == 3) {
    if ((_Var8._M_head_impl)->Debug != false) {
      return;
    }
    if ((_Var8._M_head_impl)->ExtraVerbose != false) {
      return;
    }
    _Var11._M_head_impl = *(cmGeneratedFileStream **)&((_Var8._M_head_impl)->OutputLogFile)._M_t;
    if ((__uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>)
        _Var11._M_head_impl !=
        (__uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>)0x0) {
LAB_0015d453:
      if ((_Var8._M_head_impl)->ShowLineNumbers == true) {
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)&(_Var11._M_head_impl)->super_ofstream + -0x18) +
                        (char)_Var11._M_head_impl);
        std::ostream::put((char)_Var11._M_head_impl);
        poVar6 = (ostream *)std::ostream::flush();
        if (file == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)poVar6->_vptr_basic_ostream[-3]);
        }
        else {
          sVar7 = strlen(file);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,file,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,line);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        _Var8._M_head_impl =
             (this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      }
      if ((_Var8._M_head_impl)->OutputLogFileLastTag != logType) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   ((_Var8._M_head_impl)->OutputLogFile)._M_t.
                   super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                   ,"[",1);
        uVar2._M_t.
        super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>.
        _M_t.
        super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
        .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
             (((this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->OutputLogFile)._M_t;
        if ((uint)logType < 8) {
          std::operator<<((ostream *)
                          uVar2._M_t.
                          super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                          .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                          cmCTestStringLogType[(uint)logType]);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)
                     uVar2._M_t.
                     super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                     .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,"OTHER",5);
        }
        uVar2._M_t.
        super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>.
        _M_t.
        super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
        .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
             (((this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->OutputLogFile)._M_t;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   uVar2._M_t.
                   super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                   .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,"] ",2);
        std::ios::widen((char)(*(_func_int ***)
                                uVar2._M_t.
                                super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                                .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl)
                              [-3] +
                        (char)uVar2._M_t.
                              super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                              .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl);
        std::ostream::put((char)uVar2._M_t.
                                super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                                .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl)
        ;
        std::ostream::flush();
        _Var8._M_head_impl =
             (this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      }
      _Var3._M_t.
      super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
      super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
           ((_Var8._M_head_impl)->OutputLogFile)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t;
      sVar7 = strlen(msg);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 _Var3._M_t.
                 super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                 .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,msg,sVar7);
      std::ostream::flush();
      _Var8._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      if ((_Var8._M_head_impl)->OutputLogFileLastTag != logType) {
        _Var4.
        super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>.
        _M_t.
        super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
        .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
             ((_Var8._M_head_impl)->OutputLogFile)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
        ;
        cVar1 = (char)_Var4.
                      super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                      .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)_Var4.
                                         super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                                         .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>.
                                         _M_head_impl + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        _Var8._M_head_impl =
             (this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
        (_Var8._M_head_impl)->OutputLogFileLastTag = logType;
      }
      goto LAB_0015d608;
    }
    if ((_Var8._M_head_impl)->Quiet != false) {
      return;
    }
    poVar6 = (_Var8._M_head_impl)->StreamOut;
switchD_0015d645_caseD_6:
    cVar1 = (_Var8._M_head_impl)->ShowLineNumbers;
    poVar5 = poVar6;
    goto joined_r0x0015d669;
  }
  _Var11._M_head_impl = *(cmGeneratedFileStream **)&((_Var8._M_head_impl)->OutputLogFile)._M_t;
  if (_Var11._M_head_impl != (cmGeneratedFileStream *)0x0) {
    if (logType == 0) {
      lVar10 = 0x29c1;
    }
    else if ((logType != 5) || (lVar10 = 0x53, (_Var8._M_head_impl)->Debug != false))
    goto LAB_0015d453;
    if (*(char *)((long)&(_Var8._M_head_impl)->RepeatCount + lVar10) == '\x01') goto LAB_0015d453;
  }
LAB_0015d608:
  if ((_Var8._M_head_impl)->Quiet != false) {
    return;
  }
  poVar5 = (_Var8._M_head_impl)->StreamOut;
  if (7 < (uint)logType) {
switchD_0015d645_caseD_3:
    poVar6 = poVar5;
    goto switchD_0015d645_caseD_6;
  }
  poVar6 = (_Var8._M_head_impl)->StreamErr;
  switch(logType) {
  case 0:
    cVar1 = (_Var8._M_head_impl)->Debug;
    goto joined_r0x0015d658;
  case 3:
    goto switchD_0015d645_caseD_3;
  case 4:
    if ((_Var8._M_head_impl)->TestProgressOutput == true) {
      if ((_Var8._M_head_impl)->ShowLineNumbers == true) {
        poVar6 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar6 = std::operator<<(poVar6,file);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,line);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        _Var8._M_head_impl =
             (this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      }
      if ((_Var8._M_head_impl)->FlushTestProgressLine == true) {
        putchar(0xd);
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->FlushTestProgressLine =
             false;
        std::ostream::flush();
      }
      local_50._M_current = (char *)local_40;
      sVar7 = strlen(msg);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,msg,msg + sVar7);
      lVar10 = std::__cxx11::string::find((char)(string *)&local_50,10);
      if (lVar10 != -1) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->FlushTestProgressLine =
             true;
        local_51 = 10;
        _Var9 = std::
                __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          (local_50,local_50._M_current + local_48,
                           (_Iter_equals_val<const_char>)&local_51);
        std::__cxx11::string::erase(&local_50,_Var9._M_current,local_50._M_current + local_48);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_50._M_current,local_48);
      printf("\x1b[K");
      std::ostream::flush();
      if ((long *)local_50._M_current == local_40) {
        return;
      }
      operator_delete(local_50._M_current,local_40[0] + 1);
      return;
    }
  default:
    if ((_Var8._M_head_impl)->Debug == false) {
      cVar1 = (_Var8._M_head_impl)->Verbose;
joined_r0x0015d658:
      if (cVar1 != '\x01') {
        return;
      }
    }
    break;
  case 5:
    if ((_Var8._M_head_impl)->Debug == false) {
      cVar1 = (_Var8._M_head_impl)->ExtraVerbose;
      goto joined_r0x0015d658;
    }
    break;
  case 6:
    goto switchD_0015d645_caseD_6;
  case 7:
    if ((_Var8._M_head_impl)->ShowLineNumbers == true) {
      poVar5 = std::endl<char,std::char_traits<char>>(poVar6);
      poVar5 = std::operator<<(poVar5,file);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,line);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    }
    sVar7 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,msg,sVar7);
    std::ostream::flush();
    cmSystemTools::s_ErrorOccurred = true;
    return;
  }
  cVar1 = (_Var8._M_head_impl)->ShowLineNumbers;
joined_r0x0015d669:
  if (cVar1 == '\x01') {
    poVar6 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar6 = std::operator<<(poVar6,file);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,line);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  }
  sVar7 = strlen(msg);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,msg,sVar7);
  std::ostream::flush();
  return;
}

Assistant:

void cmCTest::Log(int logType, const char* file, int line, const char* msg,
                  bool suppress)
{
  if (!msg || !*msg) {
    return;
  }
  if (suppress && logType != cmCTest::ERROR_MESSAGE) {
    return;
  }
  if (logType == cmCTest::HANDLER_PROGRESS_OUTPUT &&
      (this->Impl->Debug || this->Impl->ExtraVerbose)) {
    return;
  }
  if (this->Impl->OutputLogFile) {
    bool display = true;
    if (logType == cmCTest::DEBUG && !this->Impl->Debug) {
      display = false;
    }
    if (logType == cmCTest::HANDLER_VERBOSE_OUTPUT && !this->Impl->Debug &&
        !this->Impl->ExtraVerbose) {
      display = false;
    }
    if (display) {
      cmCTestLogOutputFileLine(*this->Impl->OutputLogFile);
      if (logType != this->Impl->OutputLogFileLastTag) {
        *this->Impl->OutputLogFile << "[";
        if (logType >= OTHER || logType < 0) {
          *this->Impl->OutputLogFile << "OTHER";
        } else {
          *this->Impl->OutputLogFile << cmCTestStringLogType[logType];
        }
        *this->Impl->OutputLogFile << "] " << std::endl;
      }
      *this->Impl->OutputLogFile << msg << std::flush;
      if (logType != this->Impl->OutputLogFileLastTag) {
        *this->Impl->OutputLogFile << std::endl;
        this->Impl->OutputLogFileLastTag = logType;
      }
    }
  }
  if (!this->Impl->Quiet) {
    std::ostream& out = *this->Impl->StreamOut;
    std::ostream& err = *this->Impl->StreamErr;

    if (logType == HANDLER_TEST_PROGRESS_OUTPUT) {
      if (this->Impl->TestProgressOutput) {
        cmCTestLogOutputFileLine(out);
        if (this->Impl->FlushTestProgressLine) {
          printf("\r");
          this->Impl->FlushTestProgressLine = false;
          out.flush();
        }

        std::string msg_str{ msg };
        auto const lineBreakIt = msg_str.find('\n');
        if (lineBreakIt != std::string::npos) {
          this->Impl->FlushTestProgressLine = true;
          msg_str.erase(std::remove(msg_str.begin(), msg_str.end(), '\n'),
                        msg_str.end());
        }

        out << msg_str;
#ifndef _WIN32
        printf("\x1B[K"); // move caret to end
#endif
        out.flush();
        return;
      }
      logType = HANDLER_OUTPUT;
    }

    switch (logType) {
      case DEBUG:
        if (this->Impl->Debug) {
          cmCTestLogOutputFileLine(out);
          out << msg;
          out.flush();
        }
        break;
      case OUTPUT:
      case HANDLER_OUTPUT:
        if (this->Impl->Debug || this->Impl->Verbose) {
          cmCTestLogOutputFileLine(out);
          out << msg;
          out.flush();
        }
        break;
      case HANDLER_VERBOSE_OUTPUT:
        if (this->Impl->Debug || this->Impl->ExtraVerbose) {
          cmCTestLogOutputFileLine(out);
          out << msg;
          out.flush();
        }
        break;
      case WARNING:
        cmCTestLogOutputFileLine(err);
        err << msg;
        err.flush();
        break;
      case ERROR_MESSAGE:
        cmCTestLogOutputFileLine(err);
        err << msg;
        err.flush();
        cmSystemTools::SetErrorOccurred();
        break;
      default:
        cmCTestLogOutputFileLine(out);
        out << msg;
        out.flush();
    }
  }
}